

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsData.cpp
# Opt level: O1

void helicsDataBufferToString
               (HelicsDataBuffer data,char *outputString,int maxStringLen,int *actualLength)

{
  bool bVar1;
  _Alloc_hider _Var2;
  DataType baseType;
  Message *pMVar3;
  int iVar4;
  string v;
  string local_70;
  data_view local_50;
  
  if (outputString != (char *)0x0 && 0 < maxStringLen) {
    if ((data == (HelicsDataBuffer)0x0) || (*(int *)((long)data + 0x5c) != 0x24ea663f)) {
      pMVar3 = getMessageObj(data,(HelicsError *)0x0);
      data = &pMVar3->data;
      if (pMVar3 == (Message *)0x0) {
        data = (SmallBuffer *)0x0;
      }
    }
    if ((SmallBuffer *)data != (SmallBuffer *)0x0) {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      local_70._M_string_length = 0;
      local_70.field_2._M_local_buf[0] = '\0';
      local_50.dblock._M_len = ((SmallBuffer *)data)->bufferSize;
      local_50.dblock._M_str = (char *)((SmallBuffer *)data)->heap;
      local_50.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)0x0;
      local_50.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      baseType = helics::detail::detectType((byte *)local_50.dblock._M_str);
      helics::valueExtract(&local_50,baseType,&local_70);
      if (local_50.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_50.ref.
                   super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      _Var2._M_p = local_70._M_dataplus._M_p;
      iVar4 = maxStringLen;
      if ((int)local_70._M_string_length < maxStringLen) {
        iVar4 = (int)local_70._M_string_length;
      }
      bVar1 = maxStringLen <= (int)local_70._M_string_length;
      memcpy(outputString,local_70._M_dataplus._M_p,(long)iVar4);
      iVar4 = iVar4 - (uint)bVar1;
      outputString[iVar4] = '\0';
      if (actualLength != (int *)0x0) {
        *actualLength = iVar4;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var2._M_p == &local_70.field_2) {
        return;
      }
      operator_delete(_Var2._M_p,
                      CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                               local_70.field_2._M_local_buf[0]) + 1);
      return;
    }
  }
  if (actualLength != (int *)0x0) {
    *actualLength = 0;
  }
  return;
}

Assistant:

void helicsDataBufferToString(HelicsDataBuffer data, char* outputString, int maxStringLen, int* actualLength)
{
    if ((outputString == nullptr) || (maxStringLen <= 0)) {
        if (actualLength != nullptr) {
            *actualLength = 0;
        }
        return;
    }
    auto* ptr = getBuffer(data);
    if (ptr == nullptr) {
        if (actualLength != nullptr) {
            *actualLength = 0;
        }
        return;
    }
    std::string v;
    helics::valueExtract(helics::data_view(*ptr), helics::detail::detectType(ptr->data()), v);

    auto length = (std::min)(static_cast<int>(v.size()), maxStringLen);
    std::memcpy(outputString, v.data(), length);

    // add a null terminator
    if (length >= maxStringLen) {
        --length;
    }
    outputString[length] = '\0';
    if (actualLength != nullptr) {
        *actualLength = length;
    }
}